

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void custom_compare_variable_test(void)

{
  void *pvVar1;
  void *pvVar2;
  fdb_doc *pfVar3;
  fdb_status fVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  fdb_doc *pfVar8;
  size_t sVar9;
  char *__format;
  ulong uVar10;
  long lVar11;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config local_23c8;
  fdb_kvs_handle *db2;
  uint64_t user_param;
  void *params [1];
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  timeval __test_begin;
  char keybuf [256];
  char prev_key [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_doc *local_1f78 [1001];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.seqtree_opt = '\x01';
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = true;
  local_23c8.custom_cmp_param = &user_param;
  user_param = 0x1234;
  local_23c8.custom_cmp = _cmp_variable;
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&local_23c8);
  fVar4 = fdb_set_log_callback(db,logCallbackFunc,"custom_compare_variable_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x9f6);
    custom_compare_variable_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x9f6,"void custom_compare_variable_test()");
  }
  sVar9 = 0x10;
  for (uVar10 = 0; uVar10 != 1000; uVar10 = uVar10 + 1) {
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      iVar5 = rand();
      keybuf[lVar11] = (char)(iVar5 % 0x19) + 'a';
    }
    sprintf(keybuf + 2,"%06d",uVar10 & 0xffffffff);
    for (lVar11 = 8; lVar11 != 0xf; lVar11 = lVar11 + 1) {
      iVar5 = rand();
      keybuf[lVar11] = (char)(iVar5 % 0x19) + 'a';
    }
    keybuf[0xf] = '\0';
    sprintf(bodybuf,"value: %d",uVar10 & 0xffffffff);
    sVar7 = strlen(bodybuf);
    fdb_doc_create(local_1f78 + uVar10,keybuf,0x10,(void *)0x0,0,bodybuf,sVar7 + 1);
    fdb_set(db,local_1f78[uVar10]);
  }
  for (lVar11 = 0; lVar11 != 1000; lVar11 = lVar11 + 1) {
    fdb_doc_create(&rdoc,local_1f78[lVar11]->key,local_1f78[lVar11]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar4 = fdb_get(db,rdoc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa0c);
      custom_compare_variable_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa0c,"void custom_compare_variable_test()");
    }
    sVar7 = rdoc->bodylen;
    pfVar8 = local_1f78[lVar11];
    if (sVar7 != pfVar8->bodylen) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
             );
      custom_compare_variable_test()::__test_pass = '\x01';
      sVar7 = rdoc->bodylen;
      pfVar8 = local_1f78[lVar11];
      if (sVar7 != pfVar8->bodylen) {
        __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa0d,"void custom_compare_variable_test()");
      }
    }
    pfVar3 = rdoc;
    pvVar1 = rdoc->body;
    pvVar2 = pfVar8->body;
    iVar5 = bcmp(pvVar1,pvVar2,sVar7);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa0e);
      custom_compare_variable_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa0e,"void custom_compare_variable_test()");
    }
    fdb_doc_free(pfVar3);
    rdoc = (fdb_doc *)0x0;
  }
  fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
  sprintf(prev_key,"%016d",0);
  iVar5 = 1000;
  do {
    fVar4 = fdb_iterator_get(iterator,&rdoc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa1b);
      custom_compare_variable_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa1b,"void custom_compare_variable_test()");
    }
    iVar6 = _cmp_variable(prev_key,sVar9,rdoc->key,rdoc->keylen,local_23c8.custom_cmp_param);
    if (0 < iVar6) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa1e);
      custom_compare_variable_test()::__test_pass = '\x01';
      iVar6 = _cmp_variable(prev_key,sVar9,rdoc->key,rdoc->keylen,local_23c8.custom_cmp_param);
      if (0 < iVar6) {
        __assert_fail("_cmp_variable(prev_key, prev_keylen, rdoc->key, rdoc->keylen, kvs_config.custom_cmp_param) <= 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa1e,"void custom_compare_variable_test()");
      }
    }
    pfVar8 = rdoc;
    sVar9 = rdoc->keylen;
    memcpy(prev_key,rdoc->key,sVar9);
    fdb_doc_free(pfVar8);
    rdoc = (fdb_doc *)0x0;
    fVar4 = fdb_iterator_next(iterator);
    iVar5 = iVar5 + -1;
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (iVar5 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xa25);
    custom_compare_variable_test()::__test_pass = 1;
    __assert_fail("count == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa25,"void custom_compare_variable_test()");
  }
  fdb_iterator_close(iterator);
  fdb_commit(dbfile,'\x01');
  fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
  sprintf(prev_key,"%016d",0);
  sVar9 = 0x10;
  iVar5 = 1000;
  do {
    fVar4 = fdb_iterator_get(iterator,&rdoc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa31);
      custom_compare_variable_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa31,"void custom_compare_variable_test()");
    }
    iVar6 = _cmp_variable(prev_key,sVar9,rdoc->key,rdoc->keylen,local_23c8.custom_cmp_param);
    if (0 < iVar6) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa34);
      custom_compare_variable_test()::__test_pass = '\x01';
      iVar6 = _cmp_variable(prev_key,sVar9,rdoc->key,rdoc->keylen,local_23c8.custom_cmp_param);
      if (0 < iVar6) {
        __assert_fail("_cmp_variable(prev_key, prev_keylen, rdoc->key, rdoc->keylen, kvs_config.custom_cmp_param) <= 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa34,"void custom_compare_variable_test()");
      }
    }
    pfVar8 = rdoc;
    sVar9 = rdoc->keylen;
    memcpy(prev_key,rdoc->key,sVar9);
    fdb_doc_free(pfVar8);
    rdoc = (fdb_doc *)0x0;
    fVar4 = fdb_iterator_next(iterator);
    iVar5 = iVar5 + -1;
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (iVar5 == 0) {
    fdb_iterator_close(iterator);
    fdb_compact(dbfile,"./dummy2");
    fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
    sprintf(prev_key,"%016d",0);
    sVar9 = 0x10;
    iVar5 = 1000;
    do {
      fVar4 = fdb_iterator_get(iterator,&rdoc);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa48);
        custom_compare_variable_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa48,"void custom_compare_variable_test()");
      }
      iVar6 = _cmp_variable(prev_key,sVar9,rdoc->key,rdoc->keylen,local_23c8.custom_cmp_param);
      if (0 < iVar6) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa4b);
        custom_compare_variable_test()::__test_pass = '\x01';
        iVar6 = _cmp_variable(prev_key,sVar9,rdoc->key,rdoc->keylen,local_23c8.custom_cmp_param);
        if (0 < iVar6) {
          __assert_fail("_cmp_variable(prev_key, prev_keylen, rdoc->key, rdoc->keylen, kvs_config.custom_cmp_param) <= 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa4b,"void custom_compare_variable_test()");
        }
      }
      pfVar8 = rdoc;
      sVar9 = rdoc->keylen;
      memcpy(prev_key,rdoc->key,sVar9);
      fdb_doc_free(pfVar8);
      rdoc = (fdb_doc *)0x0;
      fVar4 = fdb_iterator_next(iterator);
      iVar5 = iVar5 + -1;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa52);
      custom_compare_variable_test()::__test_pass = 1;
      __assert_fail("count == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa52,"void custom_compare_variable_test()");
    }
    fdb_iterator_close(iterator);
    fdb_iterator_sequence_init(db,&iterator,0,0,0);
    iVar5 = 1000;
    do {
      fVar4 = fdb_iterator_get(iterator,&rdoc);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa5a);
        custom_compare_variable_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa5a,"void custom_compare_variable_test()");
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fVar4 = fdb_iterator_next(iterator);
      iVar5 = iVar5 + -1;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar5 == 0) {
      iVar5 = -1000;
      while( true ) {
        fVar4 = fdb_iterator_prev(iterator);
        if (fVar4 == FDB_RESULT_ITERATOR_FAIL) break;
        fVar4 = fdb_iterator_get(iterator,&rdoc);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa64);
          custom_compare_variable_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa64,"void custom_compare_variable_test()");
        }
        fdb_doc_free(rdoc);
        rdoc = (fdb_doc *)0x0;
        iVar5 = iVar5 + 1;
      }
      if (iVar5 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa68);
        custom_compare_variable_test()::__test_pass = 1;
        __assert_fail("count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa68,"void custom_compare_variable_test()");
      }
      fdb_iterator_close(iterator);
      local_23c8.custom_cmp = (fdb_custom_cmp_variable)0x0;
      local_23c8.custom_cmp_param = (void *)0x0;
      fdb_kvs_open_default(dbfile,&db2,&local_23c8);
      lVar11 = 0;
      while( true ) {
        if (lVar11 == 1000) {
          fdb_kvs_close(db);
          fdb_kvs_close(db2);
          fdb_close(dbfile);
          kvs_names[0] = (char *)0x0;
          functions[0] = _cmp_variable;
          params[0] = &user_param;
          fVar4 = fdb_open_custom_cmp(&dbfile,"./dummy2",&fconfig,1,kvs_names,functions,params);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa89);
            custom_compare_variable_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa89,"void custom_compare_variable_test()");
          }
          fVar4 = fdb_kvs_open_default(dbfile,&db,&local_23c8);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa8c);
            custom_compare_variable_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa8c,"void custom_compare_variable_test()");
          }
          lVar11 = 0;
          while( true ) {
            if (lVar11 == 1000) {
              fdb_kvs_close(db);
              fdb_close(dbfile);
              for (lVar11 = 0; lVar11 != 1000; lVar11 = lVar11 + 1) {
                fdb_doc_free(local_1f78[lVar11]);
              }
              fdb_shutdown();
              memleak_end();
              __format = "%s PASSED\n";
              if (custom_compare_variable_test()::__test_pass != '\0') {
                __format = "%s FAILED\n";
              }
              fprintf(_stderr,__format,"custom compare function for variable length key test");
              return;
            }
            fdb_doc_create(&rdoc,local_1f78[lVar11]->key,local_1f78[lVar11]->keylen,(void *)0x0,0,
                           (void *)0x0,0);
            fVar4 = fdb_get(db,rdoc);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa93);
              custom_compare_variable_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xa93,"void custom_compare_variable_test()");
            }
            sVar9 = rdoc->bodylen;
            pfVar8 = local_1f78[lVar11];
            if (sVar9 != pfVar8->bodylen) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                     );
              custom_compare_variable_test()::__test_pass = '\x01';
              sVar9 = rdoc->bodylen;
              pfVar8 = local_1f78[lVar11];
              if (sVar9 != pfVar8->bodylen) {
                __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xa94,"void custom_compare_variable_test()");
              }
            }
            pfVar3 = rdoc;
            pvVar1 = rdoc->body;
            pvVar2 = pfVar8->body;
            iVar5 = bcmp(pvVar1,pvVar2,sVar9);
            if (iVar5 != 0) break;
            fdb_doc_free(pfVar3);
            rdoc = (fdb_doc *)0x0;
            lVar11 = lVar11 + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa95);
          custom_compare_variable_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa95,"void custom_compare_variable_test()");
        }
        fdb_doc_create(&rdoc,local_1f78[lVar11]->key,local_1f78[lVar11]->keylen,(void *)0x0,0,
                       (void *)0x0,0);
        fVar4 = fdb_get(db2,rdoc);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa75);
          custom_compare_variable_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa75,"void custom_compare_variable_test()");
        }
        sVar9 = rdoc->bodylen;
        pfVar8 = local_1f78[lVar11];
        if (sVar9 != pfVar8->bodylen) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                 );
          custom_compare_variable_test()::__test_pass = '\x01';
          sVar9 = rdoc->bodylen;
          pfVar8 = local_1f78[lVar11];
          if (sVar9 != pfVar8->bodylen) {
            __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa76,"void custom_compare_variable_test()");
          }
        }
        pfVar3 = rdoc;
        pvVar1 = rdoc->body;
        pvVar2 = pfVar8->body;
        iVar5 = bcmp(pvVar1,pvVar2,sVar9);
        if (iVar5 != 0) break;
        fdb_doc_free(pfVar3);
        rdoc = (fdb_doc *)0x0;
        lVar11 = lVar11 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xa77);
      custom_compare_variable_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xa77,"void custom_compare_variable_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xa5f);
    custom_compare_variable_test()::__test_pass = 1;
    __assert_fail("count == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xa5f,"void custom_compare_variable_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xa3b);
  custom_compare_variable_test()::__test_pass = 1;
  __assert_fail("count == n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa3b,"void custom_compare_variable_test()");
}

Assistant:

void custom_compare_variable_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 1000;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    size_t keylen = 16;
    size_t prev_keylen;
    char keybuf[256], bodybuf[256];
    char prev_key[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE;
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    // open db with custom compare function for variable length key type
    //fdb_open_cmp_variable(&dbfile, "./dummy1", &fconfig);
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_variable_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        for (j=0;j<2;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        sprintf(keybuf+2, "%06d", i);
        for (j=8;(size_t)j<keylen-1;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        keybuf[keylen-1] = 0;
        sprintf(bodybuf, "value: %d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, keylen, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // range scan by sequence
    fdb_iterator_sequence_init(db, &iterator, 0, 0, 0x0);
    count = 0;
    do { // forward
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);

    // Reverse direction
    for (; fdb_iterator_prev(iterator) != FDB_RESULT_ITERATOR_FAIL; --count) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    };
    TEST_CHK(count == 0);
    fdb_iterator_close(iterator);

    // open another handle
    kvs_config.custom_cmp = NULL;
    kvs_config.custom_cmp_param = NULL;
    fdb_kvs_open_default(dbfile, &db2, &kvs_config);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db2);
    fdb_close(dbfile);

    // re-open check
    //status = fdb_open(&dbfile, "./dummy2", &fconfig);
    char* kvs_names[1] = {NULL};
    fdb_custom_cmp_variable functions[1] = {_cmp_variable};
    void* params[1] = {(void*)&user_param};
    status = fdb_open_custom_cmp(&dbfile, "./dummy2", &fconfig,
                                 1, kvs_names, functions, params);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for variable length key test");
}